

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SensorElement.cpp
# Opt level: O0

void __thiscall
iDynTree::SensorElement::SensorElement
          (SensorElement *this,XMLParserState *parserState,
          vector<std::shared_ptr<iDynTree::SensorHelper>,_std::allocator<std::shared_ptr<iDynTree::SensorHelper>_>_>
          *sensors)

{
  element_type *peVar1;
  undefined8 in_RDX;
  XMLParserState *in_RSI;
  XMLElement *in_RDI;
  Transform local_b0 [16];
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> local_39;
  string local_38 [32];
  undefined8 local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  iDynTree::XMLElement::XMLElement(in_RDI,in_RSI,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  *(undefined ***)in_RDI = &PTR__SensorElement_001dc448;
  std::make_shared<iDynTree::SensorElement::SensorInfo>();
  *(undefined8 *)(in_RDI + 0x20) = local_18;
  iDynTree::Transform::Identity();
  peVar1 = std::
           __shared_ptr_access<iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::SensorElement::SensorInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1afaa7);
  iDynTree::Transform::operator=(&peVar1->m_origin,local_b0);
  return;
}

Assistant:

SensorElement::SensorElement(
        XMLParserState& parserState, 
        std::vector<std::shared_ptr<SensorHelper>>& sensors)
    : iDynTree::XMLElement(parserState, "sensor")
    , m_info(std::make_shared<SensorInfo>())
    , m_sensors(sensors)
    {
        // Defaulting the origin
        m_info->m_origin = Transform::Identity();
    }